

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          VWReaderHandler<false> *handler)

{
  bool bVar1;
  Ch CVar2;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDX;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_RSI;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  SizeType elementCount;
  undefined4 in_stack_ffffffffffffff98;
  ParseErrorCode in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  
  GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  bVar1 = VWReaderHandler<false>::StartArray((VWReaderHandler<false> *)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError(in_RDI,in_stack_ffffffffffffff9c,0x27e3dd);
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x27e3e9);
    if (bVar1) {
      return;
    }
  }
  SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
            (in_RDI,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x27e417);
  if (!bVar1) {
    CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
    if (CVar2 == ']') {
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
      bVar1 = VWReaderHandler<false>::EndArray
                        ((VWReaderHandler<false> *)in_RDI,in_stack_ffffffffffffff9c);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError(in_RDI,in_stack_ffffffffffffff9c,0x27e4ab);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)0x27e4b7);
      }
    }
    else {
      iVar3 = 0;
      do {
        while( true ) {
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                    (in_RDX,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                            CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                     (VWReaderHandler<false> *)in_RDI);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x27e4f7);
          if (bVar1) {
            return;
          }
          iVar3 = iVar3 + 1;
          SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                    (in_RDI,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x27e52c);
          if (bVar1) {
            return;
          }
          CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
          if (CVar2 == ',') break;
          CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
          if (CVar2 == ']') {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
            bVar1 = VWReaderHandler<false>::EndArray
                              ((VWReaderHandler<false> *)in_RDI,in_stack_ffffffffffffff9c);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return;
            }
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError(in_RDI,in_stack_ffffffffffffff9c,0x27e63c);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x27e648);
            return;
          }
          GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError(in_RDI,in_stack_ffffffffffffff9c,0x27e67c);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x27e688);
          if (bVar1) {
            return;
          }
        }
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
        SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                  (in_RDI,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x27e5a1);
      } while (!bVar1);
    }
  }
  return;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '[');
        is.Take();  // Skip '['

        if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, ']')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType elementCount = 0;;) {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++elementCount;
            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (Consume(is, ',')) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            }
            else if (Consume(is, ']')) {
                if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                    RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                return;
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == ']') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }